

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionScale(Quaternion q,float mul)

{
  Quaternion QVar1;
  
  QVar1.y = q.y * mul;
  QVar1.x = q.x * mul;
  QVar1.w = q.w * mul;
  QVar1.z = q.z * mul;
  return QVar1;
}

Assistant:

RMAPI Quaternion QuaternionScale(Quaternion q, float mul)
{
    Quaternion result = { 0 };

    result.x = q.x*mul;
    result.y = q.y*mul;
    result.z = q.z*mul;
    result.w = q.w*mul;

    return result;
}